

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[14],int&,char_const(&)[22],unsigned_long>
                   (string *__return_storage_ptr__,char (*a) [14],int *b,char (*args) [22],
                   unsigned_long *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_168;
  cmAlphaNum local_130;
  cmAlphaNum local_f8;
  cmAlphaNum local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  string_view local_70;
  string *local_60;
  string_view local_58;
  string *local_48;
  string_view local_40;
  string *local_30;
  
  cmAlphaNum::cmAlphaNum(&local_c0,*a);
  local_88.first = cmAlphaNum::View(&local_c0);
  local_88.second = local_c0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_f8,*b);
  local_70 = cmAlphaNum::View(&local_f8);
  local_60 = local_f8.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_130,*args);
  local_58 = cmAlphaNum::View(&local_130);
  local_48 = local_130.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_168,*args_1);
  local_40 = cmAlphaNum::View(&local_168);
  local_30 = local_168.RValueString_;
  views._M_len = 4;
  views._M_array = &local_88;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}